

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  int iVar1;
  pointer peVar2;
  pointer piVar3;
  pointer piVar4;
  int32_t iVar5;
  pointer peVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int64_t iVar10;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __i;
  pointer peVar11;
  pointer peVar12;
  iterator iVar13;
  
  peVar11 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar11 != peVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
              (peVar11,peVar2,
               (int)LZCOUNT(((long)peVar2 - (long)peVar11 >> 3) * -0x71c71c71c71c71c7) * 2 ^ 0x7e);
    if ((long)peVar2 - (long)peVar11 < 0x481) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar11,peVar2);
    }
    else {
      peVar6 = peVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar11,peVar6);
      for (; peVar6 != peVar2; peVar6 = peVar6 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                  (peVar6);
      }
    }
  }
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  peVar6 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)peVar2 - (long)peVar6;
  lVar7 = (lVar9 >> 3) * -0x71c71c71c71c71c7 >> 2;
  peVar11 = peVar6;
  lVar8 = lVar9;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    peVar11 = peVar6 + 2;
    do {
      iVar10 = t;
      if (((peVar11[-2].type == word) || (iVar10 = tl, peVar11[-2].type == label)) &&
         (peVar11[-2].count < iVar10)) {
        peVar11 = peVar11 + -2;
        goto LAB_0011d10c;
      }
      iVar10 = t;
      if (((peVar11[-1].type == word) || (iVar10 = tl, peVar11[-1].type == label)) &&
         (peVar11[-1].count < iVar10)) {
        peVar11 = peVar11 + -1;
        goto LAB_0011d10c;
      }
      iVar10 = t;
      if (((peVar11->type == word) || (iVar10 = tl, peVar11->type == label)) &&
         (peVar11->count < iVar10)) goto LAB_0011d10c;
      iVar10 = t;
      if (((peVar11[1].type == word) || (iVar10 = tl, peVar11[1].type == label)) &&
         (peVar11[1].count < iVar10)) {
        peVar11 = peVar11 + 1;
        goto LAB_0011d10c;
      }
      lVar8 = lVar8 + -1;
      peVar11 = peVar11 + 4;
    } while (1 < lVar8);
    lVar8 = (long)peVar2 - (long)(peVar6 + lVar7 * 4);
    peVar11 = peVar6 + lVar7 * 4;
  }
  lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
  iVar13._M_current = peVar2;
  if (lVar8 == 1) {
LAB_0011d0d1:
    iVar10 = t;
    if (((peVar11->type != word) && (iVar10 = tl, peVar11->type != label)) ||
       (iVar10 <= peVar11->count)) goto LAB_0011d1bb;
  }
  else if (lVar8 == 2) {
LAB_0011d0b1:
    iVar10 = t;
    if (((peVar11->type != word) && (iVar10 = tl, peVar11->type != label)) ||
       (iVar10 <= peVar11->count)) {
      peVar11 = peVar11 + 1;
      goto LAB_0011d0d1;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_0011d1bb;
    iVar10 = t;
    if (((peVar11->type != word) && (iVar10 = tl, peVar11->type != label)) ||
       (iVar10 <= peVar11->count)) {
      peVar11 = peVar11 + 1;
      goto LAB_0011d0b1;
    }
  }
LAB_0011d10c:
  peVar12 = peVar11 + 1;
  iVar13._M_current = peVar11;
  if (peVar12 != peVar2 && peVar11 != peVar2) {
    do {
      iVar10 = t;
      if (((peVar12->type != word) && (iVar10 = tl, peVar12->type != label)) ||
         (iVar10 <= peVar12->count)) {
        std::__cxx11::string::operator=((string *)peVar11,(string *)peVar12);
        peVar11->count = peVar12->count;
        peVar11->type = peVar12->type;
        piVar4 = (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar3 = (peVar11->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (peVar11->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (peVar11->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
        (peVar11->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
        (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
        (peVar12->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (piVar3 != (pointer)0x0) {
          operator_delete(piVar3);
        }
        peVar11 = peVar11 + 1;
      }
      peVar12 = peVar12 + 1;
    } while (peVar12 != peVar2);
    peVar6 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(this->words_).
                  super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)peVar6;
    iVar13._M_current = peVar11;
  }
LAB_0011d1bb:
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (&this->words_,iVar13,(entry *)((long)&(peVar6->word)._M_dataplus._M_p + lVar9));
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>,_true>::
    _S_do_it(&this->words_);
  }
  this->size_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  piVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar4) {
    memset(piVar3,0xff,((long)piVar4 + (-4 - (long)piVar3) & 0xfffffffffffffffcU) + 4);
  }
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar11 = (this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start; peVar11 != peVar2; peVar11 = peVar11 + 1) {
    iVar5 = find(this,&peVar11->word);
    iVar1 = this->size_;
    this->size_ = iVar1 + 1;
    piVar3[iVar5] = iVar1;
    if (peVar11->type == label) {
      this->nlabels_ = this->nlabels_ + 1;
    }
    else if (peVar11->type == word) {
      this->nwords_ = this->nwords_ + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}